

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O3

wchar_t player_get_channeling_boost(player *p)

{
  short sVar1;
  
  sVar1 = p->msp;
  if (0 < sVar1) {
    return ((int)(((long)p->csp * (long)p->csp * ((long)p->lev * 2 + 0x2d)) /
                 (long)(ulong)(uint)((int)sVar1 * (int)sVar1)) + 5) / 10;
  }
  return L'\0';
}

Assistant:

int player_get_channeling_boost(struct player *p)
{
	long max_channeling = 45 + (2 * p->lev);
	long channeling = 0L;
	int boost;

	if (p->msp > 0) {
		channeling = (max_channeling * p->csp * p->csp)	/ (p->msp * p->msp);
	}
	boost = ((int) channeling + 5) / 10;

	return boost;
}